

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O1

uint32 __thiscall rw::MaterialList::streamGetSize(MaterialList *this)

{
  long lVar1;
  int iVar2;
  uint32 uVar3;
  long lVar4;
  uint32 uVar5;
  long lVar6;
  
  uVar5 = this->numMaterials * 4 + 0x10;
  if (0 < this->numMaterials) {
    lVar6 = 0;
    do {
      lVar4 = lVar6;
      do {
        if (lVar4 < 1) {
          iVar2 = 5;
          goto LAB_0010b900;
        }
        lVar1 = lVar4 + -1;
        lVar4 = lVar4 + -1;
      } while (this->materials[lVar6] != this->materials[lVar1]);
      iVar2 = 8;
LAB_0010b900:
      if (iVar2 != 8) {
        if (iVar2 != 5) {
          return uVar5;
        }
        uVar3 = Material::streamGetSize(this->materials[lVar6]);
        uVar5 = uVar5 + uVar3 + 0xc;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < this->numMaterials);
  }
  return uVar5;
}

Assistant:

uint32
MaterialList::streamGetSize(void)
{
	uint32 size = 12 + 4 + this->numMaterials*4;
	for(int32 i = 0; i < this->numMaterials; i++){
		for(int32 j = i-1; j >= 0; j--)
			if(this->materials[i] == this->materials[j])
				goto found;
		size += 12 + this->materials[i]->streamGetSize();
		found:;
	}
	return size;
}